

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O0

void __thiscall
LDPC4QKD::RateAdaptiveCode<unsigned_int>::RateAdaptiveCode<unsigned_int>
          (RateAdaptiveCode<unsigned_int> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *colptr,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *rowIdx,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *rows_to_combine_rate_adapt,
          uint initial_row_combs)

{
  iterator __first;
  iterator __last;
  reference puVar1;
  size_type sVar2;
  domain_error *pdVar3;
  ulong uVar4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_38;
  uint local_2c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_28;
  uint initial_row_combs_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *rows_to_combine_rate_adapt_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *rowIdx_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *colptr_local;
  RateAdaptiveCode<unsigned_int> *this_local;
  
  local_2c = initial_row_combs;
  pvStack_28 = rows_to_combine_rate_adapt;
  rows_to_combine_rate_adapt_local = rowIdx;
  rowIdx_local = colptr;
  colptr_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(rowIdx);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(rowIdx);
  local_38 = std::
             max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                       (__first._M_current,__last._M_current);
  puVar1 = __gnu_cxx::
           __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           ::operator*(&local_38);
  this->n_mother_rows = (ulong)(*puVar1 + 1);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(colptr);
  this->n_cols = sVar2 - 1;
  compute_mother_pos_varn<unsigned_int>(&this->mother_pos_varn,colptr,rowIdx);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->rows_to_combine,rows_to_combine_rate_adapt);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->pos_checkn);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->pos_varn);
  this->n_ra_rows = 0;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->rows_to_combine);
  if ((sVar2 & 1) != 0) {
    pdVar3 = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error
              (pdVar3,
               "The number of rows to combine for rate adaption (size of argument array) is an odd number (expected even)."
              );
    __cxa_throw(pdVar3,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  uVar4 = (ulong)local_2c;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->rows_to_combine);
  if (sVar2 >> 1 < uVar4) {
    pdVar3 = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error
              (pdVar3,
               "The number of desired initial row combinations for rate adaption is larger than the given array of lines to combine."
              );
    __cxa_throw(pdVar3,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  recompute_pos_vn_cn(this,(ulong)local_2c);
  return;
}

Assistant:

RateAdaptiveCode(std::vector<colptr_t> colptr,
                         std::vector<idx_t> rowIdx,
                         std::vector<idx_t> rows_to_combine_rate_adapt,
                         idx_t initial_row_combs = 0)
                : n_mother_rows(*std::max_element(rowIdx.begin(), rowIdx.end()) + 1u),
                  n_cols(colptr.size() - 1),
                  mother_pos_varn(compute_mother_pos_varn(colptr, rowIdx)), // computed here and henceforth `const`!
                  rows_to_combine(std::move(rows_to_combine_rate_adapt)) {
            if (rows_to_combine.size() % 2 != 0) {
                throw std::domain_error("The number of rows to combine for rate adaption "
                                        "(size of argument array) is an odd number (expected even).");
            }

            if (initial_row_combs > rows_to_combine.size() / 2) {
                throw std::domain_error("The number of desired initial row combinations for rate adaption "
                                        "is larger than the given array of lines to combine.");
            }

            // compute current `pos_varn` and `pos_checkn` from `mother_pos_varn`
            recompute_pos_vn_cn(initial_row_combs);
        }